

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
ft::map<int,int,ft::less<int>,ft::allocator<ft::pair<int_const,int>>>::
insert<ft::constTreeIterator<ft::pair<int_const,int>,ft::allocator<ft::treeNode<ft::pair<int_const,int>>>>>
          (map<int,int,ft::less<int>,ft::allocator<ft::pair<int_const,int>>> *this,
          constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
          *first,constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                 *last,type *param_3)

{
  bool bVar1;
  const_reference val;
  pair<ft::treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>,_bool>
  local_48;
  type *local_28;
  type *param_3_local;
  constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  *last_local;
  constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  *first_local;
  map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this_local;
  
  local_28 = param_3;
  param_3_local = last;
  last_local = first;
  first_local = (constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                 *)this;
  while( true ) {
    bVar1 = operator!=(&first->
                        super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                       ,&last->
                         super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                      );
    if (!bVar1) break;
    val = constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
          ::operator*(first);
    map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::insert
              (&local_48,
               (map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)this,val);
    pair<ft::treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>,_bool>
    ::~pair(&local_48);
    treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    ::operator++(&first->
                  super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                );
  }
  return;
}

Assistant:

void	insert(Iterator first, Iterator last,
			 		typename ft::_void_t<typename ft::iterator_traits<Iterator>::iterator_category>::type * = 0)
	{
		while (first != last)
		{
			this->insert(*first);
			++first;
		}
	}